

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

int GPU_GetNumRegisteredRenderers(void)

{
  int local_10;
  int local_c;
  int i;
  int count;
  
  gpu_init_renderer_register();
  local_c = 0;
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    if (_gpu_renderer_register[local_10].id.renderer != 0) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int GPU_GetNumRegisteredRenderers(void)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer != GPU_RENDERER_UNKNOWN)
			count++;
	}
	return count;
}